

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::dtime_t,duckdb::dtime_t>
          (BaseAppender *this,Vector *col,dtime_t input)

{
  dtime_t dVar1;
  
  dVar1 = Cast::Operation<duckdb::dtime_t,duckdb::dtime_t>(input);
  *(int64_t *)(col->data + (this->chunk).count * 8) = dVar1.micros;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}